

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_dart_generator.cc
# Opt level: O2

void __thiscall
t_dart_generator::generate_dart_struct(t_dart_generator *this,t_struct *tstruct,bool is_exception)

{
  int iVar1;
  undefined4 extraout_var;
  ostream *poVar2;
  int __oflag;
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_> *out;
  string imports;
  string file_name;
  string f_struct_name;
  ofstream_with_content_based_conditional_update f_struct;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  string local_288;
  string local_268;
  string local_248;
  string local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  string local_1e8;
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_> local_1c8;
  t_dart_generator *this_00;
  
  iVar1 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
  this_00 = (t_dart_generator *)CONCAT44(extraout_var,iVar1);
  std::__cxx11::string::string((string *)&local_1e8,(string *)this_00);
  get_file_name(&local_268,this_00,&local_1e8);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::operator+(&local_2a8,&this->src_dir_,"/");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1c8,
                 &local_2a8,&local_268);
  std::operator+(&local_208,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1c8,
                 ".dart");
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_2a8);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
  template_ofstream_with_content_based_conditional_update(&local_1c8);
  std::__cxx11::string::string
            ((string *)&local_2a8,local_208._M_dataplus._M_p,(allocator *)&local_288);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::open
            (&local_1c8,(char *)&local_2a8,__oflag);
  std::__cxx11::string::~string((string *)&local_2a8);
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1c])(&local_2a8,this);
  poVar2 = std::operator<<((ostream *)&local_1c8,(string *)&local_2a8);
  std::__cxx11::string::string((string *)&local_228,(string *)&local_268);
  dart_library(&local_288,this,&local_228);
  poVar2 = std::operator<<(poVar2,(string *)&local_288);
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_288);
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::string::~string((string *)&local_2a8);
  local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
  local_2a8._M_string_length = 0;
  local_2a8.field_2._M_local_buf[0] = '\0';
  dart_thrift_imports_abi_cxx11_(&local_288,this);
  poVar2 = std::operator<<((ostream *)&local_1c8,(string *)&local_288);
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_288);
  std::__cxx11::string::string((string *)&local_248,(string *)&local_268);
  out = &local_1c8;
  generate_dart_struct_definition(this,(ostream *)out,tstruct,is_exception,false,&local_248);
  iVar1 = (int)out;
  std::__cxx11::string::~string((string *)&local_248);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::close
            (&local_1c8,iVar1);
  std::__cxx11::string::~string((string *)&local_2a8);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
  ~template_ofstream_with_content_based_conditional_update(&local_1c8);
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::string::~string((string *)&local_268);
  return;
}

Assistant:

void t_dart_generator::generate_dart_struct(t_struct* tstruct, bool is_exception) {
  string file_name = get_file_name(tstruct->get_name());
  string f_struct_name = src_dir_ + "/" + file_name + ".dart";
  ofstream_with_content_based_conditional_update f_struct;
  f_struct.open(f_struct_name.c_str());

  f_struct << autogen_comment() << dart_library(file_name) << endl;

  string imports;

  f_struct << dart_thrift_imports() << endl;

  generate_dart_struct_definition(f_struct, tstruct, is_exception, false, file_name);

  f_struct.close();
}